

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnCodeMetadataCount
          (BinaryReaderIR *this,Index function_index,Index count)

{
  Func *pFVar1;
  _Map_pointer __src;
  ulong uVar2;
  _Map_pointer ppEVar3;
  Entry *pEVar4;
  _Elt_pointer pEVar5;
  size_t sVar6;
  _Map_pointer ppEVar7;
  long lVar8;
  long lVar9;
  _Map_pointer __dest;
  
  pEVar5 = (this->code_metadata_queue_).entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pFVar1 = (this->module_->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
           _M_impl.super__Vector_impl_data._M_start[function_index];
  if (pEVar5 != (this->code_metadata_queue_).entries.
                super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    pEVar5->func = pFVar1;
    std::
    _Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
    ::_Deque_base(&(pEVar5->func_queue).
                   super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
                 );
    pEVar5 = (this->code_metadata_queue_).entries.
             super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    goto LAB_00117efc;
  }
  ppEVar7 = (this->code_metadata_queue_).entries.
            super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  __src = (this->code_metadata_queue_).entries.
          super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar9 = (long)ppEVar7 - (long)__src >> 3;
  if (((long)(this->code_metadata_queue_).entries.
             super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
      (long)(this->code_metadata_queue_).entries.
            super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) / 0x58 +
      ((long)pEVar5 -
      (long)(this->code_metadata_queue_).entries.
            super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) / 0x58 +
      (lVar9 + -1 + (ulong)(ppEVar7 == (_Map_pointer)0x0)) * 5 == 0x1745d1745d1745d) {
    std::__throw_length_error("cannot create std::deque larger than max_size()");
  }
  ppEVar3 = (this->code_metadata_queue_).entries.
            super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
            ._M_impl.super__Deque_impl_data._M_map;
  uVar2 = (this->code_metadata_queue_).entries.
          super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
          ._M_impl.super__Deque_impl_data._M_map_size;
  if (uVar2 - ((long)ppEVar7 - (long)ppEVar3 >> 3) < 2) {
    if (lVar9 * 2 + 4U < uVar2) {
      __dest = (_Map_pointer)((long)ppEVar3 + (uVar2 - (lVar9 + 2) & 0xfffffffffffffffe) * 4);
      if (__dest < __src) {
        sVar6 = (long)ppEVar7 + (8 - (long)__src);
        ppEVar7 = __dest;
        if (sVar6 != 0) {
LAB_00117e6a:
          memmove(ppEVar7,__src,sVar6);
        }
      }
      else {
        sVar6 = (long)ppEVar7 + (8 - (long)__src);
        if (sVar6 != 0) {
          ppEVar7 = (_Map_pointer)((long)__dest + ((lVar9 + 1) * 8 - sVar6));
          goto LAB_00117e6a;
        }
      }
    }
    else {
      lVar8 = uVar2 * 2 + (ulong)(uVar2 == 0);
      uVar2 = lVar8 + 2;
      if (uVar2 >> 0x3c != 0) {
        if (uVar2 >> 0x3d != 0) {
          std::__throw_bad_array_new_length();
        }
        std::__throw_bad_alloc();
      }
      ppEVar3 = (_Map_pointer)operator_new(uVar2 * 8);
      __dest = (_Map_pointer)((long)ppEVar3 + (lVar8 - lVar9 & 0xfffffffffffffffeU) * 4);
      ppEVar7 = (this->code_metadata_queue_).entries.
                super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      sVar6 = (long)(this->code_metadata_queue_).entries.
                    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node + (8 - (long)ppEVar7);
      if (sVar6 != 0) {
        memmove(__dest,ppEVar7,sVar6);
      }
      operator_delete((this->code_metadata_queue_).entries.
                      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                      ._M_impl.super__Deque_impl_data._M_map,
                      (this->code_metadata_queue_).entries.
                      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                      ._M_impl.super__Deque_impl_data._M_map_size << 3);
      (this->code_metadata_queue_).entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_map = ppEVar3;
      (this->code_metadata_queue_).entries.
      super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ._M_impl.super__Deque_impl_data._M_map_size = uVar2;
    }
    (this->code_metadata_queue_).entries.
    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node = __dest;
    pEVar4 = *__dest;
    (this->code_metadata_queue_).entries.
    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = pEVar4;
    (this->code_metadata_queue_).entries.
    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = pEVar4 + 5;
    (this->code_metadata_queue_).entries.
    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = __dest + lVar9;
    pEVar4 = __dest[lVar9];
    (this->code_metadata_queue_).entries.
    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = pEVar4;
    (this->code_metadata_queue_).entries.
    super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = pEVar4 + 5;
  }
  pEVar4 = (Entry *)operator_new(0x1b8);
  (this->code_metadata_queue_).entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node[1] = pEVar4;
  pEVar5 = (this->code_metadata_queue_).entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pEVar5->func = pFVar1;
  std::
  _Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
  ::_Deque_base(&(pEVar5->func_queue).
                 super__Deque_base<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
               );
  ppEVar7 = (this->code_metadata_queue_).entries.
            super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  (this->code_metadata_queue_).entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = ppEVar7 + 1;
  pEVar5 = ppEVar7[1];
  (this->code_metadata_queue_).entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = pEVar5;
  (this->code_metadata_queue_).entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = pEVar5 + 5;
LAB_00117efc:
  (this->code_metadata_queue_).entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = pEVar5;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnCodeMetadataCount(Index function_index, Index count) {
  code_metadata_queue_.push_func(module_->funcs[function_index]);
  return Result::Ok;
}